

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O1

bool __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store>::optimize
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store> *this)

{
  Expression *pEVar1;
  LocalGet *get;
  LocalSet *set;
  bool bVar2;
  Sets *pSVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  
  pEVar1 = this->curr->ptr;
  if (pEVar1->_id == BinaryId) {
    if ((*(int *)(pEVar1 + 1) == 0x19) || (*(int *)(pEVar1 + 1) == 0)) {
      bVar2 = tryToOptimizeConstant
                        (this,*(Expression **)(pEVar1 + 2),(Expression *)pEVar1[1].type.id);
      if (bVar2) {
        return false;
      }
      bVar2 = tryToOptimizeConstant
                        (this,(Expression *)pEVar1[1].type.id,*(Expression **)(pEVar1 + 2));
      if (bVar2) {
        return false;
      }
    }
  }
  else if (pEVar1->_id == ConstId) {
    optimizeConstantPointer(this);
    return false;
  }
  if (this->localGraph == (LazyLocalGraph *)0x0) {
    return false;
  }
  get = (LocalGet *)this->curr->ptr;
  if ((get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id == LocalGetId) {
    pSVar3 = LazyLocalGraph::getSets(this->localGraph,get);
    p_Var6 = (_Base_ptr)
             (pSVar3->
             super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
             ).flexible._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var5 = p_Var6;
    if (p_Var6 == (_Base_ptr)0x0) {
      p_Var5 = (_Base_ptr)
               (pSVar3->
               super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
               ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
    }
    if (p_Var5 == (_Base_ptr)0x1) {
      p_Var5 = p_Var6;
      if (p_Var6 != (_Base_ptr)0x0) {
        p_Var5 = (pSVar3->
                 super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                 ).flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      p_Var5 = p_Var5 + 1;
      if (p_Var6 == (_Base_ptr)0x0) {
        p_Var5 = (_Base_ptr)
                 &(pSVar3->
                  super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
      }
      set = *(LocalSet **)p_Var5;
      if (set != (LocalSet *)0x0) {
        p_Var4 = &(this->parent->propagatable)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (this->parent->propagatable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        p_Var5 = &p_Var4->_M_header;
        for (; p_Var6 != (_Base_ptr)0x0;
            p_Var6 = (&p_Var6->_M_left)[*(LocalSet **)(p_Var6 + 1) < set]) {
          if (*(LocalSet **)(p_Var6 + 1) >= set) {
            p_Var5 = p_Var6;
          }
        }
        p_Var6 = &p_Var4->_M_header;
        if (((_Rb_tree_header *)p_Var5 != p_Var4) &&
           (p_Var6 = p_Var5, set < *(LocalSet **)(p_Var5 + 1))) {
          p_Var6 = &p_Var4->_M_header;
        }
        if ((((_Rb_tree_header *)p_Var6 != p_Var4) && (pEVar1 = set->value, pEVar1->_id == BinaryId)
            ) && (*(int *)(pEVar1 + 1) == 0)) {
          bVar2 = tryToOptimizePropagatedAdd
                            (this,*(Expression **)(pEVar1 + 2),(Expression *)pEVar1[1].type.id,get,
                             set);
          bVar7 = true;
          if ((bVar2) ||
             (bVar2 = tryToOptimizePropagatedAdd
                                (this,(Expression *)pEVar1[1].type.id,*(Expression **)(pEVar1 + 2),
                                 get,set), bVar2)) goto LAB_009b89e4;
        }
      }
    }
  }
  bVar7 = false;
LAB_009b89e4:
  if (bVar7 == false) {
    return false;
  }
  return bVar7;
}

Assistant:

bool optimize() {
    // The pointer itself may be a constant, if e.g. it was precomputed or
    // a get that we propagated.
    if (curr->ptr->template is<Const>()) {
      optimizeConstantPointer();
      return false;
    }
    if (auto* add = curr->ptr->template dynCast<Binary>()) {
      if (add->op == AddInt32 || add->op == AddInt64) {
        // Look for a constant on both sides.
        if (tryToOptimizeConstant(add->right, add->left) ||
            tryToOptimizeConstant(add->left, add->right)) {
          return false;
        }
      }
    }
    if (localGraph) {
      // A final important case is a propagated add:
      //
      //  x = y + 10
      //  ..
      //  load(x)
      // =>
      //  x = y + 10
      //  ..
      //  load(y, offset=10)
      //
      // This is only valid if y does not change in the middle!
      if (auto* get = curr->ptr->template dynCast<LocalGet>()) {
        auto& sets = localGraph->getSets(get);
        if (sets.size() == 1) {
          auto* set = *sets.begin();
          // May be a zero-init (in which case, we can ignore it). Must also be
          // valid to propagate, as checked earlier in the parent.
          if (set && parent->isPropagatable(set)) {
            auto* value = set->value;
            if (auto* add = value->template dynCast<Binary>()) {
              if (add->op == AddInt32) {
                // We can optimize on either side, but only if both we find
                // a constant *and* the other side cannot change in the middle.
                // TODO If it could change, we may add a new local to capture
                //      the old value.
                if (tryToOptimizePropagatedAdd(
                      add->right, add->left, get, set) ||
                    tryToOptimizePropagatedAdd(
                      add->left, add->right, get, set)) {
                  return true;
                }
              }
            }
          }
        }
      }
    }
    return false;
  }